

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx512vnni.cpp
# Opt level: O2

void ncnn::transpose_pack_A_tile_int8_avx512vnni(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  void *pvVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  undefined1 (*pauVar19) [64];
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  undefined1 *puVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 in_ZMM4 [64];
  long local_a8;
  long local_a0;
  long local_98;
  
  iVar13 = A->w;
  lVar33 = (long)iVar13;
  pauVar19 = (undefined1 (*) [64])AT->data;
  lVar7 = (long)k;
  lVar22 = (long)(iVar13 * 2);
  lVar29 = (long)(iVar13 * 4);
  local_a8 = (long)i;
  lVar9 = (long)max_ii;
  local_a0 = iVar13 * 3 + local_a8;
  lVar18 = local_a8 + lVar22;
  lVar14 = (iVar13 * 3 + 1) + local_a8;
  lVar28 = (iVar13 + 1) + local_a8;
  lVar30 = (iVar13 + 3) + local_a8;
  lVar20 = (iVar13 + 2) + local_a8;
  auVar37 = vpbroadcastd_avx512f(ZEXT416(0x7f7f7f7f));
  local_98 = lVar33 + local_a8;
  lVar26 = local_a8 + lVar22 + 1;
  for (uVar24 = 0; (long)(uVar24 | 0xf) < lVar9; uVar24 = uVar24 + 0x10) {
    pvVar12 = A->data;
    lVar16 = A->w * lVar7 * A->elemsize;
    lVar10 = (long)pvVar12 + local_a8;
    lVar8 = (long)pvVar12 + local_a0;
    lVar27 = (long)pvVar12 + lVar18;
    lVar23 = (long)pvVar12 + local_98;
    auVar41 = ZEXT1664((undefined1  [16])0x0);
    for (iVar13 = 0; iVar13 + 3 < max_kk; iVar13 = iVar13 + 4) {
      auVar35 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar10 + lVar16),
                               *(undefined1 (*) [16])(lVar23 + lVar16));
      auVar42 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar10 + lVar16),
                               *(undefined1 (*) [16])(lVar23 + lVar16));
      auVar46 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar27 + lVar16),
                               *(undefined1 (*) [16])(lVar8 + lVar16));
      auVar34 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar27 + lVar16),
                               *(undefined1 (*) [16])(lVar8 + lVar16));
      in_ZMM4 = ZEXT1664(auVar34);
      auVar40 = vpunpcklwd_avx(auVar35,auVar46);
      auVar35 = vpunpckhwd_avx(auVar35,auVar46);
      auVar46 = vpunpcklwd_avx(auVar42,auVar34);
      auVar42 = vpunpckhwd_avx(auVar42,auVar34);
      auVar36._0_16_ = ZEXT116(0) * auVar42 + ZEXT116(1) * auVar46;
      auVar36._16_16_ = ZEXT116(1) * auVar42;
      auVar38 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar35,
                                               ZEXT116(0) * auVar35 + ZEXT116(1) * auVar40)),auVar36
                           ,1);
      auVar41 = vpdpbusd_avx512_vnni(auVar41,auVar37,auVar38);
      auVar38 = vmovdqu64_avx512f(auVar38);
      *pauVar19 = auVar38;
      pauVar19 = pauVar19 + 1;
      lVar10 = lVar10 + lVar29;
      lVar8 = lVar8 + lVar29;
      lVar27 = lVar27 + lVar29;
      lVar23 = lVar23 + lVar29;
    }
    if (3 < max_kk) {
      auVar41 = vmovdqu64_avx512f(auVar41);
      *pauVar19 = auVar41;
      pauVar19 = pauVar19 + 1;
    }
    for (; iVar13 + 1 < max_kk; iVar13 = iVar13 + 2) {
      auVar34 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar10 + lVar16),
                               *(undefined1 (*) [16])(lVar23 + lVar16));
      auVar42 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar10 + lVar16),
                               *(undefined1 (*) [16])(lVar23 + lVar16));
      *(undefined1 (*) [16])*pauVar19 = auVar34;
      *(undefined1 (*) [16])(*pauVar19 + 0x10) = auVar42;
      pauVar19 = (undefined1 (*) [64])(*pauVar19 + 0x20);
      lVar10 = lVar10 + lVar22;
      lVar23 = lVar23 + lVar22;
    }
    puVar11 = (undefined8 *)(lVar10 + lVar16);
    for (; iVar13 < max_kk; iVar13 = iVar13 + 1) {
      uVar6 = puVar11[1];
      *(undefined8 *)*pauVar19 = *puVar11;
      *(undefined8 *)(*pauVar19 + 8) = uVar6;
      pauVar19 = (undefined1 (*) [64])(*pauVar19 + 0x10);
      puVar11 = (undefined8 *)((long)puVar11 + lVar33);
    }
    local_a8 = local_a8 + 0x10;
    local_a0 = local_a0 + 0x10;
    lVar18 = lVar18 + 0x10;
    local_98 = local_98 + 0x10;
    lVar14 = lVar14 + 0x10;
    lVar28 = lVar28 + 0x10;
    lVar26 = lVar26 + 0x10;
    lVar30 = lVar30 + 0x10;
    lVar20 = lVar20 + 0x10;
  }
  auVar39._8_4_ = 0x7f7f7f7f;
  auVar39._0_8_ = 0x7f7f7f7f7f7f7f7f;
  auVar39._12_4_ = 0x7f7f7f7f;
  auVar39._16_4_ = 0x7f7f7f7f;
  auVar39._20_4_ = 0x7f7f7f7f;
  auVar39._24_4_ = 0x7f7f7f7f;
  auVar39._28_4_ = 0x7f7f7f7f;
  for (; auVar42 = _DAT_00538880, (long)(uVar24 | 7) < lVar9; uVar24 = uVar24 + 8) {
    pvVar12 = A->data;
    lVar16 = A->w * lVar7 * A->elemsize;
    lVar10 = (long)pvVar12 + local_a8;
    lVar27 = local_a0 + (long)pvVar12;
    lVar8 = (long)pvVar12 + lVar18;
    lVar23 = (long)pvVar12 + local_98;
    auVar37 = ZEXT1664((undefined1  [16])0x0);
    for (iVar13 = 0; iVar13 + 3 < max_kk; iVar13 = iVar13 + 4) {
      auVar42._8_8_ = 0;
      auVar42._0_8_ = *(ulong *)(lVar10 + lVar16);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(ulong *)(lVar23 + lVar16);
      auVar42 = vpunpcklbw_avx(auVar42,auVar34);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = *(ulong *)(lVar8 + lVar16);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = *(ulong *)(lVar27 + lVar16);
      auVar34 = vpunpcklbw_avx(auVar35,auVar46);
      auVar35 = vpunpcklwd_avx(auVar42,auVar34);
      in_ZMM4 = ZEXT1664(auVar35);
      auVar42 = vpunpckhwd_avx(auVar42,auVar34);
      auVar45._0_16_ = ZEXT116(0) * auVar42 + ZEXT116(1) * auVar35;
      auVar45._16_16_ = ZEXT116(1) * auVar42;
      auVar36 = vpdpbusd_avx512_vnni(auVar37._0_32_,auVar39,auVar45);
      auVar37 = ZEXT3264(auVar36);
      *(undefined1 (*) [32])*pauVar19 = auVar45;
      pauVar19 = (undefined1 (*) [64])(*pauVar19 + 0x20);
      lVar10 = lVar10 + lVar29;
      lVar27 = lVar27 + lVar29;
      lVar8 = lVar8 + lVar29;
      lVar23 = lVar23 + lVar29;
    }
    if (3 < max_kk) {
      *(undefined1 (*) [32])*pauVar19 = auVar37._0_32_;
      pauVar19 = (undefined1 (*) [64])(*pauVar19 + 0x20);
    }
    for (; iVar13 + 1 < max_kk; iVar13 = iVar13 + 2) {
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *(ulong *)(lVar10 + lVar16);
      auVar43._8_8_ = 0;
      auVar43._0_8_ = *(ulong *)(lVar23 + lVar16);
      auVar42 = vpunpcklbw_avx(auVar40,auVar43);
      *(undefined1 (*) [16])*pauVar19 = auVar42;
      pauVar19 = (undefined1 (*) [64])(*pauVar19 + 0x10);
      lVar10 = lVar10 + lVar22;
      lVar23 = lVar23 + lVar22;
    }
    puVar11 = (undefined8 *)(lVar10 + lVar16);
    for (; iVar13 < max_kk; iVar13 = iVar13 + 1) {
      *(undefined8 *)*pauVar19 = *puVar11;
      pauVar19 = (undefined1 (*) [64])(*pauVar19 + 8);
      puVar11 = (undefined8 *)((long)puVar11 + lVar33);
    }
    local_a8 = local_a8 + 8;
    local_a0 = local_a0 + 8;
    lVar18 = lVar18 + 8;
    local_98 = local_98 + 8;
    lVar14 = lVar14 + 8;
    lVar28 = lVar28 + 8;
    lVar26 = lVar26 + 8;
    lVar30 = lVar30 + 8;
    lVar20 = lVar20 + 8;
  }
  auVar34 = vpbroadcastd_avx512vl();
  vpmulld_avx(auVar34,_DAT_00538450);
  auVar44._8_4_ = 0x7f7f7f7f;
  auVar44._0_8_ = 0x7f7f7f7f7f7f7f7f;
  auVar44._12_4_ = 0x7f7f7f7f;
  for (; (long)(uVar24 | 3) < lVar9; uVar24 = uVar24 + 4) {
    lVar31 = A->w * lVar7 * A->elemsize;
    pvVar12 = A->data;
    lVar10 = (long)pvVar12 + local_a8;
    lVar23 = lVar30 + (long)pvVar12;
    lVar8 = (long)pvVar12 + lVar20;
    lVar27 = (long)pvVar12 + lVar28;
    lVar16 = (long)pvVar12 + local_98;
    auVar37 = ZEXT1664((undefined1  [16])0x0);
    iVar17 = 1;
    for (iVar13 = 0; iVar13 + 3 < max_kk; iVar13 = iVar13 + 4) {
      auVar34 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
      auVar34 = vpgatherdd((undefined1  [16])0x0,auVar34);
      auVar34 = vpshufb_avx(auVar34,auVar42);
      in_ZMM4 = ZEXT1664(auVar34);
      auVar35 = vpdpbusd_avx512_vnni(auVar37._0_16_,auVar44,auVar34);
      auVar37 = ZEXT1664(auVar35);
      *(undefined1 (*) [16])*pauVar19 = auVar34;
      pauVar19 = (undefined1 (*) [64])(*pauVar19 + 0x10);
      lVar10 = lVar10 + lVar29;
      lVar23 = lVar23 + lVar29;
      lVar8 = lVar8 + lVar29;
      lVar27 = lVar27 + lVar29;
      iVar17 = iVar17 + 4;
      lVar16 = lVar16 + lVar29;
    }
    if (3 < max_kk) {
      *(undefined1 (*) [16])*pauVar19 = auVar37._0_16_;
      pauVar19 = (undefined1 (*) [64])(*pauVar19 + 0x10);
    }
    for (; iVar17 < max_kk; iVar17 = iVar17 + 2) {
      (*pauVar19)[0] = *(undefined1 *)(lVar10 + lVar31);
      (*pauVar19)[1] = *(undefined1 *)(lVar16 + lVar31);
      (*pauVar19)[2] = *(undefined1 *)(lVar10 + 1 + lVar31);
      (*pauVar19)[3] = *(undefined1 *)(lVar27 + lVar31);
      (*pauVar19)[4] = *(undefined1 *)(lVar10 + 2 + lVar31);
      (*pauVar19)[5] = *(undefined1 *)(lVar8 + lVar31);
      (*pauVar19)[6] = *(undefined1 *)(lVar10 + 3 + lVar31);
      (*pauVar19)[7] = *(undefined1 *)(lVar23 + lVar31);
      pauVar19 = (undefined1 (*) [64])(*pauVar19 + 8);
      lVar10 = lVar10 + lVar22;
      lVar23 = lVar23 + lVar22;
      lVar8 = lVar8 + lVar22;
      lVar27 = lVar27 + lVar22;
      lVar16 = lVar16 + lVar22;
    }
    puVar25 = (undefined1 *)(lVar10 + lVar31);
    for (iVar17 = iVar17 + -1; iVar17 < max_kk; iVar17 = iVar17 + 1) {
      (*pauVar19)[0] = *puVar25;
      (*pauVar19)[1] = puVar25[1];
      (*pauVar19)[2] = puVar25[2];
      (*pauVar19)[3] = puVar25[3];
      pauVar19 = (undefined1 (*) [64])(*pauVar19 + 4);
      puVar25 = puVar25 + lVar33;
    }
    local_a8 = local_a8 + 4;
    local_a0 = local_a0 + 4;
    lVar18 = lVar18 + 4;
    local_98 = local_98 + 4;
    lVar14 = lVar14 + 4;
    lVar28 = lVar28 + 4;
    lVar26 = lVar26 + 4;
    lVar30 = lVar30 + 4;
    lVar20 = lVar20 + 4;
  }
  for (; (long)(uVar24 | 1) < lVar9; uVar24 = uVar24 + 2) {
    pvVar12 = A->data;
    lVar8 = A->w * lVar7 * A->elemsize;
    lVar20 = local_a8 + (long)pvVar12;
    lVar27 = lVar14 + (long)pvVar12;
    lVar10 = (long)pvVar12 + lVar28;
    lVar30 = local_a0 + (long)pvVar12;
    lVar23 = lVar26 + (long)pvVar12;
    lVar16 = (long)pvVar12 + local_98;
    iVar32 = 0;
    iVar21 = 1;
    iVar13 = 0;
    for (iVar17 = 3; iVar17 < max_kk; iVar17 = iVar17 + 4) {
      cVar1 = *(char *)(lVar20 + lVar8);
      (*pauVar19)[0] = cVar1;
      cVar2 = *(char *)(lVar16 + lVar8);
      (*pauVar19)[1] = cVar2;
      cVar3 = *(char *)(lVar23 + -1 + lVar8);
      (*pauVar19)[2] = cVar3;
      cVar4 = *(char *)(lVar30 + lVar8);
      (*pauVar19)[3] = cVar4;
      cVar5 = *(char *)(lVar20 + 1 + lVar8);
      (*pauVar19)[4] = cVar5;
      iVar32 = (int)cVar2 + (int)cVar3 + iVar32 + cVar1 + (int)cVar4;
      cVar1 = *(char *)(lVar10 + lVar8);
      (*pauVar19)[5] = cVar1;
      cVar2 = *(char *)(lVar23 + lVar8);
      (*pauVar19)[6] = cVar2;
      cVar3 = *(char *)(lVar27 + lVar8);
      (*pauVar19)[7] = cVar3;
      iVar13 = (int)cVar1 + (int)cVar2 + iVar13 + cVar5 + (int)cVar3;
      pauVar19 = (undefined1 (*) [64])(*pauVar19 + 8);
      lVar20 = lVar20 + lVar29;
      lVar27 = lVar27 + lVar29;
      lVar10 = lVar10 + lVar29;
      lVar30 = lVar30 + lVar29;
      lVar23 = lVar23 + lVar29;
      lVar16 = lVar16 + lVar29;
      iVar21 = iVar21 + 4;
    }
    if (3 < max_kk) {
      *(int *)*pauVar19 = iVar32 * 0x7f;
      *(int *)(*pauVar19 + 4) = iVar13 * 0x7f;
      pauVar19 = (undefined1 (*) [64])(*pauVar19 + 8);
    }
    for (; iVar21 < max_kk; iVar21 = iVar21 + 2) {
      (*pauVar19)[0] = *(undefined1 *)(lVar20 + lVar8);
      (*pauVar19)[1] = *(undefined1 *)(lVar16 + lVar8);
      (*pauVar19)[2] = *(undefined1 *)(lVar20 + 1 + lVar8);
      (*pauVar19)[3] = *(undefined1 *)(lVar10 + lVar8);
      pauVar19 = (undefined1 (*) [64])(*pauVar19 + 4);
      lVar20 = lVar20 + lVar22;
      lVar10 = lVar10 + lVar22;
      lVar16 = lVar16 + lVar22;
    }
    for (iVar21 = iVar21 + -1; iVar21 < max_kk; iVar21 = iVar21 + 1) {
      (*pauVar19)[0] = *(undefined1 *)(lVar20 + lVar8);
      (*pauVar19)[1] = *(undefined1 *)(lVar20 + 1 + lVar8);
      pauVar19 = (undefined1 (*) [64])(*pauVar19 + 2);
      lVar8 = lVar8 + lVar33;
    }
    local_a8 = local_a8 + 2;
    local_a0 = local_a0 + 2;
    lVar18 = lVar18 + 2;
    local_98 = local_98 + 2;
    lVar14 = lVar14 + 2;
    lVar28 = lVar28 + 2;
    lVar26 = lVar26 + 2;
  }
  for (; (long)uVar24 < lVar9; uVar24 = uVar24 + 1) {
    pvVar12 = (void *)(A->w * lVar7 * A->elemsize + (long)A->data);
    iVar13 = 0;
    for (uVar15 = 0; (int)uVar15 + 3 < max_kk; uVar15 = uVar15 + 4) {
      cVar1 = *(char *)((long)pvVar12 + local_a8);
      (*pauVar19)[uVar15] = cVar1;
      cVar2 = *(char *)((long)pvVar12 + local_98);
      (*pauVar19)[uVar15 + 1] = cVar2;
      cVar3 = *(char *)((long)pvVar12 + lVar18);
      (*pauVar19)[uVar15 + 2] = cVar3;
      cVar4 = *(char *)((long)pvVar12 + local_a0);
      (*pauVar19)[uVar15 + 3] = cVar4;
      iVar13 = (int)cVar2 + (int)cVar3 + iVar13 + cVar1 + (int)cVar4;
      pvVar12 = (void *)((long)pvVar12 + lVar29);
    }
    if (max_kk < 4) {
      pauVar19 = (undefined1 (*) [64])(*pauVar19 + uVar15);
    }
    else {
      puVar25 = *pauVar19;
      pauVar19 = (undefined1 (*) [64])((long)(puVar25 + uVar15) + 4);
      *(int *)(puVar25 + uVar15) = iVar13 * 0x7f;
    }
    puVar25 = (undefined1 *)((long)pvVar12 + local_a8);
    for (; (int)uVar15 < max_kk; uVar15 = (ulong)((int)uVar15 + 1)) {
      (*pauVar19)[0] = *puVar25;
      pauVar19 = (undefined1 (*) [64])(*pauVar19 + 1);
      puVar25 = puVar25 + lVar33;
    }
    local_a8 = local_a8 + 1;
    local_a0 = local_a0 + 1;
    lVar18 = lVar18 + 1;
    local_98 = local_98 + 1;
  }
  return;
}

Assistant:

void transpose_pack_A_tile_int8_avx512vnni(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    transpose_pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
}